

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

FilePath * testing::internal::GetCurrentExecutableName(void)

{
  FilePath *in_RDI;
  FilePath result;
  string *in_stack_ffffffffffffff88;
  FilePath *this;
  pointer in_stack_ffffffffffffffa0;
  FilePath *in_stack_ffffffffffffffd8;
  
  this = in_RDI;
  FilePath::FilePath(in_RDI);
  GetArgvs_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&stack0xffffffffffffffa0,0);
  FilePath::FilePath(this,in_stack_ffffffffffffff88);
  FilePath::Set(this,(FilePath *)in_stack_ffffffffffffff88);
  FilePath::~FilePath((FilePath *)0x159cfe);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffffa0);
  FilePath::RemoveDirectoryName(in_stack_ffffffffffffffd8);
  FilePath::~FilePath((FilePath *)0x159d21);
  return in_RDI;
}

Assistant:

FilePath GetCurrentExecutableName() {
  FilePath result;

#if GTEST_OS_WINDOWS || GTEST_OS_OS2
  result.Set(FilePath(GetArgvs()[0]).RemoveExtension("exe"));
#else
  result.Set(FilePath(GetArgvs()[0]));
#endif  // GTEST_OS_WINDOWS

  return result.RemoveDirectoryName();
}